

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::nuraft_global_mgr::request_append(nuraft_global_mgr *this,ptr<raft_server> *server)

{
  bool bVar1;
  int iVar2;
  status sVar3;
  element_type *peVar4;
  element_type *peVar5;
  size_type sVar6;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::shared_ptr<nuraft::raft_server>,_true,_false>,_bool> pVar7
  ;
  ptr<worker_handle> *wh;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *entry_1;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *__range1;
  ptr<logger> *l_;
  iterator entry;
  lock_guard<std::mutex> l;
  unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *in_stack_ffffffffffffff28;
  element_type *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  _Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false> in_stack_ffffffffffffff40;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  local_88;
  long local_80;
  string local_78 [32];
  ptr<logger> *local_58;
  _Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false> local_50;
  undefined1 local_48;
  int local_3c;
  _Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false> local_38 [3];
  _Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false> local_20 [4];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff30,
             (mutex_type *)in_stack_ffffffffffffff28);
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x2bc983);
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(local_20,local_38);
  if (bVar1) {
    local_3c = 1;
  }
  else {
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
    ::push_back((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 *)in_stack_ffffffffffffff40._M_cur,
                (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pVar7 = std::
            unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
            ::insert((unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                      *)in_stack_ffffffffffffff40._M_cur,
                     (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff40._M_cur =
         (__node_type *)
         pVar7.first.super__Node_iterator_base<std::shared_ptr<nuraft::raft_server>,_false>._M_cur;
    local_48 = pVar7.second;
    local_50._M_cur = in_stack_ffffffffffffff40._M_cur;
    peVar4 = std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2bca4f);
    local_58 = &peVar4->l_;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2bca80);
      iVar2 = (*peVar5->_vptr_logger[7])();
      if (5 < iVar2) {
        in_stack_ffffffffffffff28 =
             (unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              *)std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bcaac);
        in_stack_ffffffffffffff30 =
             std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
        sVar6 = std::__cxx11::
                list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                ::size((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                        *)in_stack_ffffffffffffff30);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,
                   "added append request to global queue, server %p, queue length %zu",
                   in_stack_ffffffffffffff30,sVar6);
        (*(code *)(in_stack_ffffffffffffff28->_M_h)._M_buckets[8])
                  (in_stack_ffffffffffffff28,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                   ,"request_append",0xdf,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    local_3c = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2bcb61);
  if (local_3c == 0) {
    local_80 = in_RDI + 0x70;
    local_88._M_current =
         (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)
         std::
         vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
         ::begin((vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
                  *)in_stack_ffffffffffffff28);
    std::
    vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
    ::end((vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
           *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
      ::operator*(&local_88);
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2bcbd7);
      sVar3 = std::atomic::operator_cast_to_status
                        ((atomic<nuraft::nuraft_global_mgr::worker_handle::status> *)0x2bcbe3);
      if (sVar3 == SLEEPING) {
        std::
        __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2bcbf2);
        EventAwaiter::invoke((EventAwaiter *)in_stack_ffffffffffffff40._M_cur);
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
      ::operator++(&local_88);
    }
  }
  return;
}

Assistant:

void nuraft_global_mgr::request_append(ptr<raft_server> server) {
    {
        std::lock_guard<std::mutex> l(append_queue_lock_);
        // First search the set if the server is duplicate.
        auto entry = append_server_set_.find(server);
        if (entry != append_server_set_.end()) {
            // `server` is already in the queue. Ignore it.
            return;
        }

        // Put into queue.
        append_queue_.push_back(server);
        append_server_set_.insert(server);

        ptr<logger>& l_ = server->l_;
        p_tr("added append request to global queue, "
             "server %p, queue length %zu",
             server.get(),
             append_queue_.size());
    }

    // Find a sleeping worker and invoke.
    for (auto& entry: append_workers_) {
        ptr<worker_handle>& wh = entry;
        if (wh->status_ == worker_handle::SLEEPING) {
            wh->ea_.invoke();
            break;
        }
    }
    // If all workers are working, nothing to do for now.
}